

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void __thiscall asmjit::ZoneAllocator::_releaseDynamic(ZoneAllocator *this,void *p,size_t size)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  Zone *pZVar4;
  DynamicBlock *pDVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint uVar8;
  DynamicBlock **ppDVar9;
  Zone *pZVar10;
  Slot *pSVar11;
  uint extraout_EDX;
  DynamicBlock **ppDVar12;
  uint8_t *extraout_RDX;
  ZoneAllocator *pZVar13;
  ZoneAllocator *pZVar14;
  uint uVar15;
  ulong uVar16;
  size_t sStack_40;
  
  if (this->_zone == (Zone *)0x0) {
    _releaseDynamic();
  }
  else {
    pZVar13 = *(ZoneAllocator **)((long)p + -8);
    ppDVar9 = &this->_dynamicBlocks;
    ppDVar12 = ppDVar9;
    do {
      pZVar14 = (ZoneAllocator *)*ppDVar12;
      if (pZVar14 == pZVar13) break;
      ppDVar12 = (DynamicBlock **)pZVar14->_slots;
    } while (pZVar14 != (ZoneAllocator *)0x0);
    this = pZVar13;
    if (pZVar14 != (ZoneAllocator *)0x0) {
      pZVar4 = pZVar13->_zone;
      pDVar5 = (DynamicBlock *)pZVar13->_slots[0];
      ppDVar12 = (DynamicBlock **)&pZVar4->_end;
      if (pZVar4 == (Zone *)0x0) {
        ppDVar12 = ppDVar9;
      }
      *ppDVar12 = pDVar5;
      if (pDVar5 != (DynamicBlock *)0x0) {
        pDVar5->prev = (DynamicBlock *)pZVar4;
      }
      free(pZVar13);
      return;
    }
  }
  _releaseDynamic();
  if (extraout_EDX < 0x81) {
    pZVar13 = (ZoneAllocator *)p;
    pZVar14 = this;
    if (((ZoneAllocator *)p)->_zone == (Zone *)0x0) goto LAB_0012327b;
    uVar16 = (ulong)extraout_EDX;
    uVar8 = *(uint *)(ZoneHash_primeArray + uVar16 * 8);
    pZVar4 = this->_zone;
    pZVar13 = (ZoneAllocator *)((ulong)uVar8 * 8);
    pZVar10 = (Zone *)_allocZeroed((ZoneAllocator *)p,(size_t)pZVar13,&sStack_40);
    if (pZVar10 == (Zone *)0x0) {
      return;
    }
    uVar2 = *(uint *)(this->_slots + 1);
    pZVar14 = (ZoneAllocator *)(ulong)uVar2;
    this->_zone = pZVar10;
    *(uint *)(this->_slots + 1) = uVar8;
    *(int *)((long)this->_slots + 0xc) = (int)(long)((double)uVar8 * 0.9);
    uVar3 = *(uint *)(ZoneHash_primeArray + uVar16 * 8 + 4);
    *(uint *)(this->_slots + 2) = uVar3;
    bVar1 = ZoneHash_primeShift[uVar16];
    *(byte *)((long)this->_slots + 0x14) = bVar1;
    *(char *)((long)this->_slots + 0x15) = (char)extraout_EDX;
    if (pZVar14 != (ZoneAllocator *)0x0) {
      pZVar13 = (ZoneAllocator *)0x0;
      do {
        puVar7 = (&pZVar4->_ptr)[(long)pZVar13];
        while (puVar7 != (uint8_t *)0x0) {
          puVar6 = *(uint8_t **)puVar7;
          uVar15 = *(uint *)(puVar7 + 8) -
                   (int)((ulong)*(uint *)(puVar7 + 8) * (ulong)uVar3 >> (bVar1 & 0x3f)) * uVar8;
          *(uint8_t **)puVar7 = (&pZVar10->_ptr)[uVar15];
          (&pZVar10->_ptr)[uVar15] = puVar7;
          puVar7 = puVar6;
        }
        pZVar13 = (ZoneAllocator *)((long)&pZVar13->_zone + 1);
      } while (pZVar13 != pZVar14);
    }
    if (pZVar4 == (Zone *)(this->_slots + 3)) {
      return;
    }
    if (((ZoneAllocator *)p)->_zone == (Zone *)0x0) goto LAB_00123280;
    if (pZVar4 != (Zone *)0x0) {
      if (pZVar14 != (ZoneAllocator *)0x0) {
        if (0x40 < uVar2) {
          _releaseDynamic((ZoneAllocator *)p,pZVar4,(long)pZVar14 * 8);
          return;
        }
        ZoneHashBase::_rehash();
        return;
      }
      goto LAB_0012328a;
    }
  }
  else {
    ZoneHashBase::_rehash();
    pZVar13 = (ZoneAllocator *)p;
    pZVar14 = this;
LAB_0012327b:
    ZoneHashBase::_rehash();
LAB_00123280:
    ZoneHashBase::_rehash();
  }
  ZoneHashBase::_rehash();
LAB_0012328a:
  ZoneHashBase::_rehash();
  uVar8 = *(uint *)(extraout_RDX + 8) -
          (int)((ulong)*(uint *)(pZVar14->_slots + 2) * (ulong)*(uint *)(extraout_RDX + 8) >>
               (*(byte *)((long)pZVar14->_slots + 0x14) & 0x3f)) * *(int *)(pZVar14->_slots + 1);
  pZVar4 = pZVar14->_zone;
  *(uint8_t **)extraout_RDX = (&pZVar4->_ptr)[uVar8];
  (&pZVar4->_ptr)[uVar8] = extraout_RDX;
  pSVar11 = (Slot *)((long)&pZVar14->_slots[0]->next + 1);
  pZVar14->_slots[0] = pSVar11;
  if ((Slot *)(ulong)*(uint *)((long)pZVar14->_slots + 0xc) < pSVar11) {
    bVar1 = *(byte *)((long)pZVar14->_slots + 0x15);
    uVar8 = 0x7e;
    if (bVar1 < 0x7e) {
      uVar8 = (uint)bVar1;
    }
    if ((uint)bVar1 < uVar8 + 2) {
      ZoneHashBase::_rehash((ZoneHashBase *)pZVar14,pZVar13,uVar8 + 2);
    }
  }
  return;
}

Assistant:

void ZoneAllocator::_releaseDynamic(void* p, size_t size) noexcept {
  DebugUtils::unused(size);
  ASMJIT_ASSERT(isInitialized());

  // Pointer to `DynamicBlock` is stored at [-1].
  DynamicBlock* block = reinterpret_cast<DynamicBlock**>(p)[-1];
  ASMJIT_ASSERT(ZoneAllocator_hasDynamicBlock(this, block));

  // Unlink and free.
  DynamicBlock* prev = block->prev;
  DynamicBlock* next = block->next;

  if (prev)
    prev->next = next;
  else
    _dynamicBlocks = next;

  if (next)
    next->prev = prev;

  ::free(block);
}